

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void start_reboot(CHAR_DATA *ch)

{
  char *pcVar1;
  char *pcVar2;
  allocator<char> local_1262;
  allocator<char> local_1261;
  CHAR_DATA *ch_local;
  string local_1258;
  string local_1238;
  char buf [4608];
  
  ch_local = ch;
  if (reboot_num == 0) {
    reboot_now(ch);
    return;
  }
  if (reboot_num == -1) {
    rebooting = false;
    do_echo(ch,"*** REBOOT CANCELLED ***");
    return;
  }
  if ((reboot_num < 6) || ((uint)reboot_num % 5 == 0)) {
    pcVar1 = int_to_cap_string(reboot_num);
    pcVar2 = "S";
    if (reboot_num == 1) {
      pcVar2 = "";
    }
    sprintf(buf,"*** REBOOT IN %s MINUTE%s ***",pcVar1,pcVar2);
    do_echo(ch,buf);
    reboot_num = reboot_num + -1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1238,"start_reboot",&local_1261);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1258,"start_reboot",&local_1262);
    CQueue::AddToQueue<void(*)(char_data*),char_data*&>
              (&RS.Queue,0x3c,&local_1238,&local_1258,start_reboot,&ch_local);
    std::__cxx11::string::~string((string *)&local_1258);
    std::__cxx11::string::~string((string *)&local_1238);
  }
  return;
}

Assistant:

void start_reboot(CHAR_DATA *ch)
{
	char buf[MSL];

	if (reboot_num == -1)
	{
		rebooting = false;
		do_echo(ch, "*** REBOOT CANCELLED ***");
	}
	else if (reboot_num == 0)
	{
		reboot_now(ch);
	}
	else
	{
		if (reboot_num < 6 || (reboot_num % 5 == 0))
		{
			sprintf(buf, "*** REBOOT IN %s MINUTE%s ***", int_to_cap_string(reboot_num), (reboot_num == 1) ? "" : "S");
			do_echo(ch, buf);

			reboot_num--;
			RS.Queue.AddToQueue(60, "start_reboot", "start_reboot", start_reboot, ch);
		}
	}
}